

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O0

bool __thiscall
libtorrent::posix_disk_io::async_write
          (posix_disk_io *this,storage_index_t storage,peer_request *r,char *buf,
          shared_ptr<libtorrent::disk_observer> *param_4,
          function<void_(const_libtorrent::storage_error_&)> *handler,disk_job_flags_t param_6)

{
  settings_interface *psVar1;
  io_context *ctx;
  bool bVar2;
  value_type *this_00;
  pointer this_01;
  type local_d8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a0;
  rep local_98;
  int64_t local_90;
  int64_t write_time;
  void *local_80;
  size_t local_78;
  uint local_6c;
  undefined1 auStack_68 [8];
  storage_error error;
  time_point start_time;
  span<char> b;
  function<void_(const_libtorrent::storage_error_&)> *handler_local;
  shared_ptr<libtorrent::disk_observer> *param_5_local;
  char *buf_local;
  peer_request *r_local;
  posix_disk_io *this_local;
  disk_job_flags_t param_7_local;
  storage_index_t storage_local;
  
  span<char>::span((span<char> *)&start_time,buf,(long)r->length);
  error._16_8_ = ::std::chrono::_V2::system_clock::now();
  storage_error::storage_error((storage_error *)auStack_68);
  local_6c = storage.m_val;
  this_00 = libtorrent::aux::
            container_wrapper<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>_>
            ::operator[](&this->m_torrents,
                         (strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>)
                         storage.m_val);
  this_01 = ::std::
            unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
            ::operator->(this_00);
  psVar1 = this->m_settings;
  span<char_const>::span<char,void>((span<char_const> *)&local_80,(span<char> *)&start_time);
  write_time._4_4_ = (r->piece).m_val;
  libtorrent::aux::posix_storage::write(this_01,(int)psVar1,local_80,local_78);
  bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_68);
  if (!bVar2) {
    local_a0.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
    local_98 = (rep)::std::chrono::operator-
                              (&local_a0,
                               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&error.field_0x10);
    local_90 = total_microseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_>)local_98);
    counters::inc_stats_counter(this->m_stats_counters,0x6f,1);
    counters::inc_stats_counter(this->m_stats_counters,0x72,1);
    counters::inc_stats_counter(this->m_stats_counters,0x76,local_90);
    counters::inc_stats_counter(this->m_stats_counters,0x78,local_90);
  }
  ctx = this->m_ios;
  ::std::function<void_(const_libtorrent::storage_error_&)>::function(&local_d8.h,handler);
  local_d8.error._16_3_ = error.ec.cat_._0_3_;
  local_d8.error.operation = error.ec.cat_._3_1_;
  local_d8.error.ec.val_ = auStack_68._0_4_;
  local_d8.error.ec.failed_ = (bool)auStack_68[4];
  local_d8.error.ec._5_3_ = auStack_68._5_3_;
  local_d8.error.ec.cat_ = (error_category *)error.ec._0_8_;
  boost::asio::
  post<boost::asio::io_context,libtorrent::posix_disk_io::async_write(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::peer_request_const&,char_const*,std::shared_ptr<libtorrent::disk_observer>,std::function<void(libtorrent::storage_error_const&)>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_job_flags_tag,void>)::_lambda()_1_>
            (ctx,&local_d8,(type *)0x0);
  async_write(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::peer_request_const&,char_const*,std::shared_ptr<libtorrent::disk_observer>,std::function<void(libtorrent::storage_error_const&)>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_job_flags_tag,void>)
  ::{lambda()#1}::~bitfield_flag((_lambda___1_ *)&local_d8);
  return false;
}

Assistant:

bool async_write(storage_index_t storage, peer_request const& r
			, char const* buf, std::shared_ptr<disk_observer>
			, std::function<void(storage_error const&)> handler
			, disk_job_flags_t) override
		{
			span<char> const b = { const_cast<char*>(buf), r.length };

			time_point const start_time = clock_type::now();

			storage_error error;
			m_torrents[storage]->write(m_settings, b, r.piece, r.start, error);

			if (!error.ec)
			{
				std::int64_t const write_time = total_microseconds(clock_type::now() - start_time);

				m_stats_counters.inc_stats_counter(counters::num_blocks_written);
				m_stats_counters.inc_stats_counter(counters::num_write_ops);
				m_stats_counters.inc_stats_counter(counters::disk_write_time, write_time);
				m_stats_counters.inc_stats_counter(counters::disk_job_time, write_time);
			}

			post(m_ios, [=, h = std::move(handler)]{ h(error); });
			return false;
		}